

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDIOAnalyzer.cpp
# Opt level: O2

void __thiscall SDIOAnalyzer::SDIOAnalyzer(SDIOAnalyzer *this)

{
  SDIOAnalyzerSettings *this_00;
  FrameV2 *this_01;
  
  Analyzer2::Analyzer2(&this->super_Analyzer2);
  *(undefined ***)this = &PTR__SDIOAnalyzer_0010bca8;
  this_00 = (SDIOAnalyzerSettings *)operator_new(0xc0);
  SDIOAnalyzerSettings::SDIOAnalyzerSettings(this_00);
  (this->mSettings)._M_t.
  super___uniq_ptr_impl<SDIOAnalyzerSettings,_std::default_delete<SDIOAnalyzerSettings>_>._M_t.
  super__Tuple_impl<0UL,_SDIOAnalyzerSettings_*,_std::default_delete<SDIOAnalyzerSettings>_>.
  super__Head_base<0UL,_SDIOAnalyzerSettings_*,_false>._M_head_impl = this_00;
  (this->mResults)._M_t.
  super___uniq_ptr_impl<SDIOAnalyzerResults,_std::default_delete<SDIOAnalyzerResults>_>._M_t.
  super__Tuple_impl<0UL,_SDIOAnalyzerResults_*,_std::default_delete<SDIOAnalyzerResults>_>.
  super__Head_base<0UL,_SDIOAnalyzerResults_*,_false>._M_head_impl = (SDIOAnalyzerResults *)0x0;
  SDIOSimulationDataGenerator::SDIOSimulationDataGenerator(&this->mSimulationDataGenerator);
  this->mSimulationInitialized = false;
  this->mAlreadyRun = false;
  this->packetState = 0;
  this->frameState = 0;
  this->byteCounter = 0;
  this->byte = '\0';
  this->data[0] = '\0';
  this->data[1] = '\0';
  this->data[2] = '\0';
  this->data[3] = '\0';
  this->data[4] = '\0';
  this->data[5] = '\0';
  this->data[6] = '\0';
  this->data[7] = '\0';
  this->qwordHigh = 0;
  this->qwordLow = 0;
  this->startingSampleInclusive = 0;
  this->endingSampleInclusive = 0;
  this_01 = (FrameV2 *)operator_new(8);
  FrameV2::FrameV2(this_01);
  (this->frameV2)._M_t.super___uniq_ptr_impl<FrameV2,_std::default_delete<FrameV2>_>._M_t.
  super__Tuple_impl<0UL,_FrameV2_*,_std::default_delete<FrameV2>_>.
  super__Head_base<0UL,_FrameV2_*,_false>._M_head_impl = this_01;
  Analyzer::SetAnalyzerSettings((AnalyzerSettings *)this);
  Analyzer::UseFrameV2();
  return;
}

Assistant:

SDIOAnalyzer::SDIOAnalyzer()
    : Analyzer2(),
      mSettings( new SDIOAnalyzerSettings() ),
      mSimulationInitialized( false ),
      mAlreadyRun( false ),
      packetState( WAITING_FOR_PACKET ),
      frameState( TRANSMISSION_BIT ),
      frameV2( std::unique_ptr<FrameV2>( new FrameV2 ) )
{
    SetAnalyzerSettings( mSettings.get() );
    UseFrameV2();
}